

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O3

string_view __thiscall InputGraph::edge_label(InputGraph *this,int a,int b)

{
  iterator iVar1;
  string_view sVar2;
  key_type local_8;
  
  local_8.second = b;
  local_8.first = a;
  iVar1 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                    .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->edges)._M_t,
                 &local_8);
  sVar2._M_str = (char *)iVar1._M_node[1]._M_parent;
  sVar2._M_len = (size_t)iVar1._M_node[1]._M_left;
  return sVar2;
}

Assistant:

auto InputGraph::edge_label(int a, int b) const -> string_view
{
    return _imp->edges.find({a, b})->second;
}